

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void IfStatement_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsVm *pJVar1;
  undefined1 local_70 [8];
  JsValue r3;
  JsValue r2;
  JsValue r1;
  JsAstIfStatementNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  context->pc = na->location;
  pJVar1 = JsGetVm();
  if ((pJVar1->debug == 1) && (pJVar1 = JsGetVm(), pJVar1->trace != (JsVmTraceFn)0x0)) {
    pJVar1 = JsGetVm();
    (*pJVar1->trace)(context->engine,na->location,JS_TRACE_STATEMENT);
  }
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&r3.u + 8));
  JsToBoolean((JsValue *)((long)&r3.u + 8),(JsValue *)local_70);
  if (r3.type == JS_NULL) {
    (*JsNodeClassEval[*(uint *)&(na[1].location)->filename])
              ((JsAstNode *)na[1].location,context,res);
  }
  else if (*(long *)(na + 2) == 0) {
    res->type = JS_COMPLETION;
    (res->u).completion.type = JS_COMPLETION_NORMAL;
    (res->u).number = 0.0;
  }
  else {
    (*JsNodeClassEval[**(uint **)(na + 2)])(*(JsAstNode **)(na + 2),context,res);
  }
  return;
}

Assistant:

static void
IfStatement_eval(na, context, res)
	struct JsAstNode *na; /* (struct IfStatement_node) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstIfStatementNode *n = CAST_NODE(na, JsAstIfStatementNode);
	struct JsValue r1, r2, r3;

	TRACE(na->location, context, JS_TRACE_STATEMENT);
	EVAL(n->cond, context, &r1);
	JsGetValue( &r1, &r2);
	JsToBoolean(&r2, &r3);
	if (r3.u.boolean == TRUE)
		EVAL(n->btrue, context, res);
	else if (n->bfalse)
		EVAL(n->bfalse, context, res);
	else
		JS_SET_COMPLETION(res, JS_COMPLETION_NORMAL, NULL);
}